

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

bool Js::JavascriptLibrary::InitializeSharedArrayBufferConstructor
               (DynamicObject *sharedArrayBufferConstructor,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  ScriptContext *this_00;
  PropertyString *pPVar1;
  
  DeferredTypeHandlerBase::Convert(typeHandler,sharedArrayBufferConstructor,mode,4,0);
  this = (((sharedArrayBufferConstructor->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  this_00 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  (*(sharedArrayBufferConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (sharedArrayBufferConstructor,0xd1,&DAT_1000000000001,2,0,0,0);
  (*(sharedArrayBufferConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (sharedArrayBufferConstructor,0x124,
             (((this_00->super_ScriptContextBase).javascriptLibrary)->sharedArrayBufferPrototype).
             ptr,0,0,0,0);
  AddSpeciesAccessorsToLibraryObject
            (this,sharedArrayBufferConstructor,
             (FunctionInfo *)SharedArrayBuffer::EntryInfo::GetterSymbolSpecies);
  pPVar1 = ScriptContext::GetPropertyString(this_00,0x2cb);
  (*(sharedArrayBufferConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (sharedArrayBufferConstructor,0x106,pPVar1,2,0,0,0);
  DynamicObject::SetHasNoEnumerableProperties(sharedArrayBufferConstructor,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeSharedArrayBufferConstructor(DynamicObject* sharedArrayBufferConstructor, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(sharedArrayBufferConstructor, mode, 4);

        ScriptContext* scriptContext = sharedArrayBufferConstructor->GetScriptContext();
        JavascriptLibrary* library = sharedArrayBufferConstructor->GetLibrary();
        library->AddMember(sharedArrayBufferConstructor, PropertyIds::length, TaggedInt::ToVarUnchecked(1), PropertyConfigurable);
        library->AddMember(sharedArrayBufferConstructor, PropertyIds::prototype, scriptContext->GetLibrary()->sharedArrayBufferPrototype, PropertyNone);
        library->AddSpeciesAccessorsToLibraryObject(sharedArrayBufferConstructor, &SharedArrayBuffer::EntryInfo::GetterSymbolSpecies);
        library->AddMember(sharedArrayBufferConstructor, PropertyIds::name, scriptContext->GetPropertyString(PropertyIds::SharedArrayBuffer), PropertyConfigurable);

        sharedArrayBufferConstructor->SetHasNoEnumerableProperties(true);

        return true;
    }